

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint *puVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  undefined8 __ptr;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 local_68 [16];
  size_t local_58;
  undefined1 local_48 [16];
  size_t local_38;
  long lVar15;
  
  local_48 = (undefined1  [16])0x0;
  local_38 = 0;
  local_68 = (undefined1  [16])0x0;
  local_58 = 0;
  puVar5 = (uint *)malloc((ulong)tree->numcodes << 2);
  tree->tree1d = puVar5;
  uVar8 = (ulong)(tree->maxbitlen + 1);
  uVar4 = uivector_resize((uivector *)local_48,uVar8);
  if (uVar4 != 0) {
    if (uVar8 != 0) {
      memset((void *)local_48._0_8_,0,uVar8 << 2);
    }
    uVar8 = (ulong)(tree->maxbitlen + 1);
    uVar4 = uivector_resize((uivector *)local_68,uVar8);
    if (uVar4 != 0) {
      if (uVar8 != 0) {
        memset((void *)local_68._0_8_,0,uVar8 << 2);
      }
      if (puVar5 != (uint *)0x0) {
        if (tree->numcodes == 0) {
          uVar4 = 0;
        }
        else {
          puVar5 = tree->lengths;
          uVar4 = 0;
          do {
            *(uint *)(local_48._0_8_ + (ulong)puVar5[uVar4] * 4) =
                 *(uint *)(local_48._0_8_ + (ulong)puVar5[uVar4] * 4) + 1;
            uVar4 = uVar4 + 1;
          } while (uVar4 != tree->numcodes);
        }
        __ptr = local_68._0_8_;
        if (tree->maxbitlen != 0) {
          uVar4 = *(uint *)local_68._0_8_;
          uVar8 = 1;
          do {
            uVar4 = (uVar4 + *(uint *)(local_48._0_8_ + (ulong)((int)uVar8 - 1) * 4)) * 2;
            *(uint *)(local_68._0_8_ + uVar8 * 4) = uVar4;
            uVar7 = (int)uVar8 + 1;
            uVar8 = (ulong)uVar7;
          } while (uVar7 <= tree->maxbitlen);
          uVar4 = tree->numcodes;
        }
        if (uVar4 != 0) {
          puVar5 = tree->lengths;
          uVar7 = 0;
          do {
            uVar8 = (ulong)puVar5[uVar7];
            if (uVar8 != 0) {
              uVar4 = *(uint *)(local_68._0_8_ + uVar8 * 4);
              *(uint *)(local_68._0_8_ + uVar8 * 4) = uVar4 + 1;
              tree->tree1d[uVar7] = uVar4;
              uVar4 = tree->numcodes;
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != uVar4);
        }
        free((void *)local_48._0_8_);
        free((void *)__ptr);
        uVar4 = tree->numcodes;
        uVar8 = (ulong)(uVar4 * 2);
        puVar5 = (uint *)malloc(uVar8 * 4);
        tree->tree2d = puVar5;
        auVar3 = _DAT_001ef010;
        if (puVar5 == (uint *)0x0) {
          return 0x53;
        }
        if (uVar8 != 0) {
          lVar15 = uVar8 - 1;
          auVar12._8_4_ = (int)lVar15;
          auVar12._0_8_ = lVar15;
          auVar12._12_4_ = (int)((ulong)lVar15 >> 0x20);
          uVar9 = 0;
          auVar12 = auVar12 ^ _DAT_001ef010;
          auVar14 = _DAT_001f04b0;
          auVar16 = _DAT_001f0450;
          do {
            auVar17 = auVar16 ^ auVar3;
            iVar13 = auVar12._4_4_;
            if ((bool)(~(auVar17._4_4_ == iVar13 && auVar12._0_4_ < auVar17._0_4_ ||
                        iVar13 < auVar17._4_4_) & 1)) {
              puVar5[uVar9] = 0x7fff;
            }
            if ((auVar17._12_4_ != auVar12._12_4_ || auVar17._8_4_ <= auVar12._8_4_) &&
                auVar17._12_4_ <= auVar12._12_4_) {
              puVar5[uVar9 + 1] = 0x7fff;
            }
            auVar17 = auVar14 ^ auVar3;
            iVar10 = auVar17._4_4_;
            if (iVar10 <= iVar13 && (iVar10 != iVar13 || auVar17._0_4_ <= auVar12._0_4_)) {
              puVar5[uVar9 + 2] = 0x7fff;
              puVar5[uVar9 + 3] = 0x7fff;
            }
            uVar9 = uVar9 + 4;
            lVar15 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 4;
            auVar16._8_8_ = lVar15 + 4;
            lVar15 = auVar14._8_8_;
            auVar14._0_8_ = auVar14._0_8_ + 4;
            auVar14._8_8_ = lVar15 + 4;
          } while ((uVar8 + 3 & 0xfffffffffffffffc) != uVar9);
        }
        if ((ulong)uVar4 != 0) {
          puVar1 = tree->lengths;
          uVar9 = 0;
          iVar10 = 0;
          iVar13 = 0;
          do {
            uVar7 = puVar1[uVar9];
            if (uVar7 != 0) {
              puVar2 = tree->tree1d;
              uVar11 = 0;
              do {
                if (iVar10 < 0) {
                  return 0x37;
                }
                if (uVar4 < iVar10 + 2U) {
                  return 0x37;
                }
                uVar6 = (uint)((puVar2[uVar9] >> (~uVar11 + uVar7 & 0x1f) & 1) != 0) + iVar10 * 2;
                if (puVar5[uVar6] == 0x7fff) {
                  uVar11 = uVar11 + 1;
                  if (uVar11 == uVar7) {
                    puVar5[uVar6] = (uint)uVar9;
                    iVar10 = 0;
                    uVar11 = uVar7;
                  }
                  else {
                    iVar10 = iVar13 + 1;
                    puVar5[uVar6] = iVar13 + uVar4 + 1;
                    iVar13 = iVar10;
                  }
                }
                else {
                  iVar10 = puVar5[uVar6] - uVar4;
                  uVar11 = uVar11 + 1;
                }
                uVar7 = puVar1[uVar9];
              } while (uVar11 != uVar7);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar4);
          if (uVar4 * 2 != 0) {
            uVar9 = 0;
            do {
              if (puVar5[uVar9] == 0x7fff) {
                puVar5[uVar9] = 0;
              }
              uVar9 = uVar9 + 1;
            } while (uVar8 != uVar9);
            return 0;
          }
        }
        return 0;
      }
    }
  }
  free((void *)local_48._0_8_);
  free((void *)local_68._0_8_);
  return 0x53;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
  uivector blcount;
  uivector nextcode;
  unsigned error = 0;
  unsigned bits, n;

  uivector_init(&blcount);
  uivector_init(&nextcode);

  tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  if(!tree->tree1d) error = 83; /*alloc fail*/

  if(!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
  || !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
    error = 83; /*alloc fail*/

  if(!error)
  {
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount.data[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits)
    {
      nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n)
    {
      if(tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
    }
  }

  uivector_cleanup(&blcount);
  uivector_cleanup(&nextcode);

  if(!error) return HuffmanTree_make2DTree(tree);
  else return error;
}